

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::Texture2DSpecCase::verifyTexture
          (Texture2DSpecCase *this,GLContext *gles3Context,ReferenceContext *refContext)

{
  Surface *dst_00;
  DataType type;
  int width;
  int height;
  DataTypes *samplerTypes;
  RenderTarget *this_00;
  PixelFormat *pixelFormat;
  TestLog *log;
  char *imageSetName;
  char *imageSetDesc;
  uint local_3dc;
  GLContext *local_3d8;
  GLContext *local_3c0;
  int local_39c;
  ConstPixelBufferAccess local_398;
  ConstPixelBufferAccess local_370;
  undefined1 local_342;
  allocator<char> local_341;
  undefined1 local_340 [6];
  bool isOk;
  undefined1 local_320 [8];
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [8];
  string name;
  string levelStr;
  undefined1 local_28c [8];
  UVec4 threshold;
  deUint32 shaderID;
  Context *ctx_1;
  Surface *dst;
  undefined1 local_260 [4];
  int ndx_1;
  Surface result;
  Surface reference;
  int levelH;
  int levelW;
  int levelNdx;
  Context *ctx;
  int ndx;
  deUint32 shaderIDRef;
  deUint32 shaderIDgles;
  Vector<float,_4> local_1fc;
  TextureFormat local_1e0;
  DataTypes local_1d8;
  undefined1 local_1b8 [8];
  Texture2DShader shader;
  ReferenceContext *refContext_local;
  GLContext *gles3Context_local;
  Texture2DSpecCase *this_local;
  
  local_1d8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shader._400_8_ = refContext;
  FboTestUtil::DataTypes::DataTypes(&local_1d8);
  local_1e0 = this->m_texFormat;
  type = glu::getSampler2DType(local_1e0);
  samplerTypes = FboTestUtil::DataTypes::operator<<(&local_1d8,type);
  tcu::Vector<float,_4>::Vector(&local_1fc,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&shaderIDRef,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_1b8,samplerTypes,TYPE_FLOAT_VEC4,&local_1fc,
             (Vec4 *)&shaderIDRef);
  FboTestUtil::DataTypes::~DataTypes(&local_1d8);
  ndx = (*(gles3Context->super_Context)._vptr_Context[0x75])(gles3Context,local_1b8);
  ctx._4_4_ = (**(code **)(*(long *)shader._400_8_ + 0x3a8))();
  FboTestUtil::Texture2DShader::setTexScaleBias
            ((Texture2DShader *)local_1b8,0,&(this->m_texFormatInfo).lookupScale,
             &(this->m_texFormatInfo).lookupBias);
  for (ctx._0_4_ = 0; (int)ctx < 2; ctx._0_4_ = (int)ctx + 1) {
    local_3c0 = gles3Context;
    if ((int)ctx != 0) {
      local_3c0 = (GLContext *)shader._400_8_;
    }
    _levelW = local_3c0;
    sglr::ContextWrapper::setContext
              (&(this->super_TextureSpecCase).super_ContextWrapper,&local_3c0->super_Context);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,0x2801,0x2700);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,0x2800,0x2600);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,0x813d,
               this->m_numLevels + -1);
  }
  for (levelH = 0; levelH < this->m_numLevels; levelH = levelH + 1) {
    width = de::max<int>(1,this->m_width >> ((byte)levelH & 0x1f));
    height = de::max<int>(1,this->m_height >> ((byte)levelH & 0x1f));
    tcu::Surface::Surface((Surface *)&result.m_pixels.m_cap);
    tcu::Surface::Surface((Surface *)local_260);
    for (dst._4_4_ = 0; dst._4_4_ < 2; dst._4_4_ = dst._4_4_ + 1) {
      if (dst._4_4_ == 0) {
        dst_00 = (Surface *)local_260;
        local_3d8 = gles3Context;
      }
      else {
        dst_00 = (Surface *)&result.m_pixels.m_cap;
        local_3d8 = (GLContext *)shader._400_8_;
      }
      stack0xfffffffffffffd88 = local_3d8;
      if (dst._4_4_ == 0) {
        local_3dc = ndx;
      }
      else {
        local_3dc = ctx._4_4_;
      }
      threshold.m_data[2] = local_3dc;
      sglr::ContextWrapper::setContext
                (&(this->super_TextureSpecCase).super_ContextWrapper,&local_3d8->super_Context);
      FboTestUtil::Texture2DShader::setUniforms
                ((Texture2DShader *)local_1b8,&stack0xfffffffffffffd88->super_Context,
                 threshold.m_data[2]);
      TextureSpecCase::renderTex
                (&this->super_TextureSpecCase,dst_00,threshold.m_data[2],width,height);
    }
    this_00 = gles3::Context::getRenderTarget
                        ((this->super_TextureSpecCase).super_TestCase.m_context);
    pixelFormat = tcu::RenderTarget::getPixelFormat(this_00);
    computeCompareThreshold((Functional *)local_28c,pixelFormat,this->m_texFormat);
    de::toString<int>((string *)((long)&name.field_2 + 8),&levelH);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"Level",(allocator<char> *)(desc.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   &local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&name.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)(desc.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_340,"Level ",&local_341);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&name.field_2 + 8));
    std::__cxx11::string::~string((string *)local_340);
    std::allocator<char>::~allocator(&local_341);
    log = tcu::TestContext::getLog
                    ((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx);
    imageSetName = (char *)std::__cxx11::string::c_str();
    imageSetDesc = (char *)std::__cxx11::string::c_str();
    tcu::Surface::getAccess((PixelBufferAccess *)&local_370,(Surface *)&result.m_pixels.m_cap);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_398,(Surface *)local_260);
    local_342 = tcu::intThresholdCompare
                          (log,imageSetName,imageSetDesc,&local_370,&local_398,(UVec4 *)local_28c,
                           COMPARE_LOG_ON_ERROR - (levelH == 0));
    if ((bool)local_342) {
      local_39c = 0;
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Image comparison failed");
      local_39c = 5;
    }
    std::__cxx11::string::~string((string *)local_320);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    tcu::Surface::~Surface((Surface *)local_260);
    tcu::Surface::~Surface((Surface *)&result.m_pixels.m_cap);
    if (local_39c != 0) break;
  }
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_1b8);
  return;
}

Assistant:

void Texture2DSpecCase::verifyTexture (sglr::GLContext& gles3Context, sglr::ReferenceContext& refContext)
{
	Texture2DShader shader			(DataTypes() << glu::getSampler2DType(m_texFormat), glu::TYPE_FLOAT_VEC4);
	deUint32		shaderIDgles	= gles3Context.createProgram(&shader);
	deUint32		shaderIDRef		= refContext.createProgram(&shader);

	shader.setTexScaleBias(0, m_texFormatInfo.lookupScale, m_texFormatInfo.lookupBias);

	// Set state.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		sglr::Context* ctx = ndx ? static_cast<sglr::Context*>(&refContext) : static_cast<sglr::Context*>(&gles3Context);

		setContext(ctx);

		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL,	m_numLevels-1);
	}

	for (int levelNdx = 0; levelNdx < m_numLevels; levelNdx++)
	{
		int				levelW		= de::max(1, m_width >> levelNdx);
		int				levelH		= de::max(1, m_height >> levelNdx);
		tcu::Surface	reference;
		tcu::Surface	result;

		for (int ndx = 0; ndx < 2; ndx++)
		{
			tcu::Surface&	dst			= ndx ? reference									: result;
			sglr::Context*	ctx			= ndx ? static_cast<sglr::Context*>(&refContext)	: static_cast<sglr::Context*>(&gles3Context);
			deUint32		shaderID	= ndx ? shaderIDRef									: shaderIDgles;

			setContext(ctx);
			shader.setUniforms(*ctx, shaderID);
			renderTex(dst, shaderID, levelW, levelH);
		}

		UVec4			threshold	= computeCompareThreshold(m_context.getRenderTarget().getPixelFormat(), m_texFormat);
		string			levelStr	= de::toString(levelNdx);
		string			name		= string("Level") + levelStr;
		string			desc		= string("Level ") + levelStr;
		bool			isOk		= tcu::intThresholdCompare(m_testCtx.getLog(), name.c_str(), desc.c_str(), reference.getAccess(), result.getAccess(), threshold,
															   levelNdx == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

		if (!isOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
			break;
		}
	}
}